

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O1

void __thiscall Am_Value::Set_Value_Type(Am_Value *this,Am_Value_Type new_type)

{
  uint *puVar1;
  Am_Wrapper *pAVar2;
  
  if (((short)this->type < 0) && (pAVar2 = (this->value).wrapper_value, pAVar2 != (Am_Wrapper *)0x0)
     ) {
    puVar1 = &pAVar2->refs;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      (*(pAVar2->super_Am_Registered_Type)._vptr_Am_Registered_Type[4])();
    }
  }
  (this->value).wrapper_value = (Am_Wrapper *)0x0;
  this->type = new_type;
  return;
}

Assistant:

void
Am_Value::Set_Value_Type(Am_Value_Type new_type)
{
  if (Am_Type_Is_Ref_Counted(type) && value.wrapper_value)
    value.wrapper_value->Release();
  value.voidptr_value = nullptr;
  type = new_type;
}